

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
                  *this,char code,bool ignore_zero)

{
  CStringRef arg0;
  int iVar1;
  NumericExpr NVar2;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
  *this_00;
  byte in_DL;
  char in_SIL;
  NLHandler<MockNLHandler,_BasicTestExpr<0>_> *in_RDI;
  double dVar3;
  double value;
  int i;
  CallArgHandler args;
  int num_args;
  int func_index;
  int in_stack_00000094;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
  *in_stack_00000098;
  ArgHandler *in_stack_ffffffffffffffa8;
  BasicCStringRef<char> in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  Reference in_stack_fffffffffffffffc;
  
  this_00 = (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
             *)(ulong)((int)in_SIL - 0x66);
  switch(this_00) {
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
        *)0x0:
    ReadUInt(in_stack_ffffffffffffffd0,(uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    iVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                      ((BinaryReader<mp::internal::IdentityConverter> *)
                       in_stack_ffffffffffffffc0.data_);
    BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)in_RDI->_vptr_NLHandler);
    NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginCall
              (in_RDI,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8
              );
    for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
                        *)CONCAT44(in_stack_fffffffffffffffc.id_,in_stack_fffffffffffffff8));
      NLHandler<MockNLHandler,_BasicTestExpr<0>_>::ArgHandler::AddArg
                (in_stack_ffffffffffffffa8,(Expr)(IDType)((ulong)in_RDI >> 0x20));
    }
    in_stack_fffffffffffffffc.id_ =
         (IDType)NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndCall
                           ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_RDI[2]._vptr_NLHandler
                           );
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffc0,"expected expression");
    arg0.data_._4_4_ = in_stack_ffffffffffffffe4;
    arg0.data_._0_4_ = in_stack_ffffffffffffffe0;
    BinaryReaderBase::ReportError<>
              ((BinaryReaderBase *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               arg0);
    goto LAB_0023d28e;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
        *)0x6:
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
        *)0x8:
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
        *)0xd:
    dVar3 = ReadConstant(in_stack_ffffffffffffffd0,(char)((ulong)in_stack_ffffffffffffffc8 >> 0x38))
    ;
    if ((((in_DL & 1) == 0) || (dVar3 != 0.0)) || (NAN(dVar3))) {
      NVar2 = NLHandler<MockNLHandler,_BasicTestExpr<0>_>::OnNumber
                        ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)this_00,(double)in_RDI);
      return (NumericExpr)NVar2.id_;
    }
LAB_0023d28e:
    BasicTestExpr<0>::BasicTestExpr((BasicTestExpr<0> *)&stack0xfffffffffffffffc,NULL_ID);
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
        *)0x9:
    ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
                *)in_stack_ffffffffffffffc0.data_);
    in_stack_fffffffffffffffc.id_ = (IDType)ReadNumericExpr(in_stack_00000098,in_stack_00000094);
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
        *)0x10:
    in_stack_fffffffffffffffc = DoReadReference(this_00);
  }
  return (NumericExpr)in_stack_fffffffffffffffc.id_;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}